

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void (anonymous_namespace)::check<Imf_3_2::InputFile,Imf_3_2::TiledOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  TiledOutputFile file;
  MultiPartInputFile file_1;
  Header f;
  long *local_88;
  long lStack_80;
  long local_78 [2];
  MultiPartInputFile local_68 [16];
  TileDescription local_58 [3];
  
  local_88 = (long *)0x0;
  Imf_3_2::Header::Header
            ((Header *)local_58,0x40,0x40,1.0,(Vec2 *)&local_88,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar4 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_88,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar4,(Channel *)"Dummy");
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012fddf;
    }
  }
  else {
LAB_0012fddf:
    Imf_3_2::Header::setType((string *)local_58);
  }
  puVar5 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar5 = 2;
  local_88 = (long *)0x2000000020;
  lStack_80 = 0;
  Imf_3_2::Header::setTileDescription(local_58);
  remove("/var/tmp/badfile.exr");
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)&local_88,"/var/tmp/badfile.exr",(Header *)local_58,iVar3);
  Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&local_88);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_68,"/var/tmp/badfile.exr",iVar3,true);
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0012fe8d;
    }
  }
  else {
LAB_0012fe8d:
    Imf_3_2::MultiPartInputFile::header((int)local_68);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 == inputtype->_M_string_length) {
      if (sVar1 != 0) {
        iVar3 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar1);
        if (iVar3 != 0) goto LAB_0012fec7;
      }
    }
    else {
LAB_0012fec7:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                          inputtype->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
      Imf_3_2::MultiPartInputFile::header((int)local_68);
      puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," from multipart when input type was ",0x24);
      sVar1 = *(size_t *)(filename + 8);
      if (sVar1 == DAT_001eeea0) {
        if (sVar1 != 0) {
          iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
          if (iVar3 != 0) goto LAB_0012ff6b;
        }
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unset","");
      }
      else {
LAB_0012ff6b:
        local_88 = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,*(long *)filename,sVar1 + *(long *)filename);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_88,lStack_80)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
    }
  }
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_00130021;
    }
  }
  else {
LAB_00130021:
    Imf_3_2::MultiPartInputFile::header((int)local_68);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar1 = puVar6[1];
    if (sVar1 != inputtype->_M_string_length) {
LAB_001302b3:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::InputFile, OUT = Imf_3_2::TiledOutputFile]"
                   );
    }
    if (sVar1 != 0) {
      iVar3 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar1);
      if (iVar3 != 0) goto LAB_001302b3;
    }
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_68);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)local_68,"/var/tmp/badfile.exr",iVar3);
  sVar1 = inputtype->_M_string_length;
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_001300aa;
    }
    Imf_3_2::InputFile::header();
    cVar2 = Imf_3_2::Header::hasType();
    if (cVar2 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_2::InputFile::header();
    cVar2 = Imf_3_2::Header::hasType();
    if (cVar2 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::InputFile, OUT = Imf_3_2::TiledOutputFile]"
                   );
    }
    goto LAB_00130287;
  }
LAB_001300aa:
  Imf_3_2::InputFile::header();
  puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  sVar1 = puVar6[1];
  if (sVar1 == inputtype->_M_string_length) {
    if (sVar1 == 0) goto LAB_00130287;
    iVar3 = bcmp((void *)*puVar6,(inputtype->_M_dataplus)._M_p,sVar1);
    if (iVar3 == 0) goto LAB_00130287;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                      inputtype->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
  Imf_3_2::InputFile::header();
  puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," when input type was ",0x15);
  sVar1 = *(size_t *)(filename + 8);
  if (sVar1 == DAT_001eeea0) {
    if (sVar1 != 0) {
      iVar3 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar1);
      if (iVar3 != 0) goto LAB_0013018c;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unset","");
  }
  else {
LAB_0013018c:
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,*(long *)filename,sVar1 + *(long *)filename);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_88,lStack_80);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
LAB_00130287:
  Imf_3_2::InputFile::~InputFile((InputFile *)local_68);
  remove("/var/tmp/badfile.exr");
  Imf_3_2::Header::~Header((Header *)local_58);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}